

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

double __thiscall
ON_SubDVertex::GetSharpSubdivisionPoint(ON_SubDVertex *this,ON_3dPoint *sharp_subdivision_point)

{
  double dVar1;
  double d;
  undefined4 uVar2;
  undefined4 uVar3;
  double c [3];
  uint count;
  ON_SubDVertex *v [3];
  double local_128;
  double dStack_120;
  double local_118;
  uint local_10c;
  ON_SubDVertex *local_108;
  long lStack_100;
  long local_f8;
  ON_3dPoint local_e8;
  ON_3dPoint local_d0;
  ON_3dPoint local_b8;
  ON_3dPoint local_a0;
  ON_3dPoint local_88;
  ON_3dPoint local_70;
  ON_3dPoint local_58;
  ON_3dPoint local_40;
  
  local_10c = 0;
  local_f8 = 0;
  local_108 = (ON_SubDVertex *)0x0;
  lStack_100 = 0;
  local_118 = 0.0;
  local_128 = 0.0;
  dStack_120 = 0.0;
  dVar1 = GetSharpSubdivisionPoint(this,&local_10c,&local_108,&local_128);
  d = local_128;
  if ((local_108 == (ON_SubDVertex *)0x0 || local_10c == 0) || dVar1 <= 0.0) {
LAB_005c9c3b:
    sharp_subdivision_point->z = ON_3dPoint::NanPoint.z;
    dVar1 = ON_3dPoint::NanPoint.y;
    sharp_subdivision_point->x = ON_3dPoint::NanPoint.x;
    sharp_subdivision_point->y = dVar1;
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
    if (local_10c == 3) {
      ON_3dPoint::ON_3dPoint(&local_a0,local_108->m_P);
      ::operator*(&local_88,d,&local_a0);
      dVar1 = dStack_120;
      ON_3dPoint::ON_3dPoint(&local_40,(double *)(lStack_100 + 0x80));
      ::operator*(&local_b8,dVar1,&local_40);
      ON_3dPoint::operator+(&local_e8,&local_88,&local_b8);
      dVar1 = local_118;
      ON_3dPoint::ON_3dPoint(&local_70,(double *)(local_f8 + 0x80));
      ::operator*(&local_58,dVar1,&local_70);
      ON_3dPoint::operator+(&local_d0,&local_e8,&local_58);
      sharp_subdivision_point->z = local_d0.z;
    }
    else {
      if (local_10c == 2) {
        ON_3dPoint::ON_3dPoint(&local_88,local_108->m_P);
        ::operator*(&local_e8,d,&local_88);
        dVar1 = dStack_120;
        ON_3dPoint::ON_3dPoint(&local_b8,(double *)(lStack_100 + 0x80));
        ::operator*(&local_a0,dVar1,&local_b8);
        ON_3dPoint::operator+(&local_d0,&local_e8,&local_a0);
      }
      else {
        if (local_10c != 1) goto LAB_005c9c3b;
        ON_3dPoint::ON_3dPoint(&local_e8,local_108->m_P);
        ::operator*(&local_d0,d,&local_e8);
      }
      sharp_subdivision_point->z = local_d0.z;
    }
    sharp_subdivision_point->x = local_d0.x;
    sharp_subdivision_point->y = local_d0.y;
  }
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

double ON_SubDVertex::GetSharpSubdivisionPoint(ON_3dPoint& sharp_subdivision_point) const
{
  unsigned count = 0;
  const ON_SubDVertex* v[3] = {};
  double c[3] = {};
  double vs = this->GetSharpSubdivisionPoint(count,v,c);
  if (vs > 0.0 && count > 0U && nullptr != v[0])
  {
    switch (count)
    {
    case 1:
      sharp_subdivision_point = c[0] * v[0]->ControlNetPoint();
      break;
    case 2:
      sharp_subdivision_point 
        = c[0] * v[0]->ControlNetPoint() 
        + c[1] * v[1]->ControlNetPoint();
      break;
    case 3:
      sharp_subdivision_point 
        = c[0] * v[0]->ControlNetPoint() 
        + c[1] * v[1]->ControlNetPoint() 
        + c[2] * v[2]->ControlNetPoint();
      break;
    default:
      vs = 0.0;
      sharp_subdivision_point = ON_3dPoint::NanPoint;
      break;
    }
  }
  else
  {
    vs = 0.0;
    sharp_subdivision_point = ON_3dPoint::NanPoint;
  }
  return vs;
}